

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_trace.c
# Opt level: O0

void trace_genrec_(Integer *ga,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,Integer *op)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  Integer *in_RCX;
  long lVar3;
  Integer *in_RDX;
  ulong uVar4;
  Integer *in_RSI;
  ulong *in_RDI;
  Integer *in_R8;
  Integer *in_R9;
  int proc;
  int nproc;
  int me;
  int block [2];
  int type;
  int hi [2];
  int lo [2];
  int tmp_dims [2];
  int dims [2];
  int ndim;
  int *proclist;
  patch_t *regions;
  undefined4 in_stack_00000050;
  char fname [15];
  FILE *fout;
  int counter;
  int has_record;
  int d;
  int i;
  int in_stack_ffffffffffffff5c;
  uint auStack_98 [12];
  void *local_68;
  void *local_60;
  char local_57 [15];
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar7;
  
  iVar1 = GA_Nodeid();
  uVar2 = GA_Nnodes();
  if (current < MAX_EVENTS) {
    if (iVar1 == 0) {
      iVar6 = 0;
      for (iVar7 = 0; iVar7 < ganum; iVar7 = iVar7 + 1) {
        if (*in_RDI == (long)galog[iVar7]) {
          iVar6 = 1;
        }
      }
      if (iVar6 == 0) {
        lVar3 = (long)ganum;
        ganum = ganum + 1;
        galog[lVar3] = (int)*in_RDI;
        sprintf(local_57,"distrib.%d",*in_RDI & 0xffffffff);
        __stream = fopen(local_57,"w");
        NGA_Inquire((int)((ulong)in_R9 >> 0x20),(int *)CONCAT44(iVar7,in_stack_ffffffffffffffc8),
                    (int *)CONCAT44(iVar6,in_stack_ffffffffffffffc0),&__stream->_flags);
        local_68 = malloc((long)(int)uVar2 << 2);
        if (local_68 == (void *)0x0) {
          GA_Error((char *)CONCAT44(iVar1,uVar2),in_stack_ffffffffffffff5c);
        }
        local_60 = malloc((long)(int)uVar2 << 4);
        if (local_60 == (void *)0x0) {
          GA_Error((char *)CONCAT44(iVar1,uVar2),in_stack_ffffffffffffff5c);
        }
        for (iVar7 = 0; iVar7 < (int)auStack_98[0xb]; iVar7 = iVar7 + 1) {
          auStack_98[(long)iVar7 + 5] = 0;
          auStack_98[(long)iVar7 + 3] = auStack_98[(long)iVar7 + 9] - 1;
        }
        iVar7 = NGA_Locate_region(in_stack_00000050,regions->lo,proclist,stack0x00000038,
                                  stack0x00000030);
        if (iVar7 < 1) {
          GA_Error((char *)CONCAT44(iVar1,uVar2),iVar7);
        }
        for (iVar1 = 0; iVar1 < (int)auStack_98[0xb]; iVar1 = iVar1 + 1) {
          auStack_98[(long)iVar1 + 7] = 0;
          auStack_98[iVar1] = 0;
          for (iVar7 = 0; iVar7 < (int)uVar2; iVar7 = iVar7 + 1) {
            if ((int)auStack_98[(long)iVar1 + 7] <
                *(int *)((long)local_60 + (long)iVar1 * 4 + (long)iVar7 * 0x10 + 8)) {
              auStack_98[iVar1] = auStack_98[iVar1] + 1;
              auStack_98[(long)iVar1 + 7] =
                   *(uint *)((long)local_60 + (long)iVar1 * 4 + (long)iVar7 * 0x10 + 8);
            }
          }
        }
        fprintf(__stream,"%d\n",(ulong)uVar2);
        for (iVar1 = 0; iVar1 < (int)auStack_98[0xb]; iVar1 = iVar1 + 1) {
          fprintf(__stream,"%d ",(ulong)auStack_98[(long)iVar1 + 9]);
        }
        fprintf(__stream,"\n");
        for (iVar1 = 0; iVar1 < (int)auStack_98[0xb]; iVar1 = iVar1 + 1) {
          if (auStack_98[iVar1] == 1) {
            fprintf(__stream,"%d ",(ulong)auStack_98[iVar1]);
          }
          else {
            fprintf(__stream,"%d ",(ulong)(auStack_98[iVar1] - 1));
          }
        }
        fprintf(__stream,"\n");
        for (iVar1 = 0; iVar1 < (int)auStack_98[0xb]; iVar1 = iVar1 + 1) {
          if (auStack_98[iVar1] == 1) {
            fprintf(__stream,"%d\n",(ulong)auStack_98[(long)iVar1 + 9]);
          }
          else {
            auStack_98[(long)iVar1 + 7] = 0;
            uVar5 = 0;
            for (iVar7 = 0; iVar7 < (int)uVar2; iVar7 = iVar7 + 1) {
              if ((int)auStack_98[(long)iVar1 + 7] <
                  *(int *)((long)local_60 + (long)iVar1 * 4 + (long)iVar7 * 0x10 + 8)) {
                uVar5 = uVar5 + 1;
                if (uVar5 == auStack_98[iVar1]) break;
                fprintf(__stream,"%d\n",
                        (ulong)(*(int *)((long)local_60 + (long)iVar1 * 4 + (long)iVar7 * 0x10 + 8)
                               + 1));
                auStack_98[(long)iVar1 + 7] =
                     *(uint *)((long)local_60 + (long)iVar1 * 4 + (long)iVar7 * 0x10 + 8);
              }
            }
          }
        }
        fclose(__stream);
        free(local_60);
        free(local_68);
      }
    }
    uVar4 = (ulong)(tt0 * 1000000.0);
    tlog[current * 2] =
         uVar4 | (long)(tt0 * 1000000.0 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f;
    uVar4 = (ulong)(tt1 * 1000000.0);
    tlog[current * 2 + 1] =
         uVar4 | (long)(tt1 * 1000000.0 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f;
    indlog[current * 6] = *in_RDI;
    indlog[current * 6 + 1] = *in_RSI;
    indlog[current * 6 + 2] = *in_RDX;
    indlog[current * 6 + 3] = *in_RCX;
    indlog[current * 6 + 4] = *in_R8;
    indlog[current * 6 + 5] = *in_R9;
    current = current + 1;
  }
  return;
}

Assistant:

void trace_genrec_(Integer *ga, Integer *ilo, Integer *ihi, Integer *jlo, Integer *jhi,
                   Integer *op)
{
    int i, d, has_record, counter;
    FILE *fout;
    char fname[15];
    typedef struct {
       int lo[2];
       int hi[2];
    } patch_t;
    patch_t *regions;
    int *proclist;
    int ndim, dims[2], tmp_dims[2], lo[2], hi[2], type, block[2];
    int me=GA_Nodeid(), nproc=GA_Nnodes(), proc;
    
    if(current >=  MAX_EVENTS) return;

    /* only node 0 does the bookkeeping */
    if(me == 0) {
        /* test if this ga has been recorded */
        has_record = 0;
        for(i=0; i<ganum; i++)
            if(*ga == (long) galog[i]) has_record = 1;

        if(!has_record) {
            galog[ganum++] = (int)*ga;
            
            sprintf(fname, "distrib.%d",(int) *ga);
            fout = fopen(fname,"w");
            
            NGA_Inquire((int)*ga, &type, &ndim, dims);
            
            /* get memory for arrays describing distribution */
            proclist = (int*)malloc(nproc*sizeof(int));
            if(!proclist)GA_Error("malloc failed for proclist",0);
            regions = (patch_t*)malloc(nproc*sizeof(patch_t));
            if(!regions)GA_Error("malloc failed for regions",0);

            for(d=0; d<ndim; d++) { lo[d] = 0; hi[d] = dims[d] -1;}

            proc = NGA_Locate_region((int)*ga, lo, hi, (int*)regions, proclist);
            if(proc<1) GA_Error("error in NGA_Locate_region",proc);
            
            for(d=0; d<ndim; d++) {
                tmp_dims[d] = 0; block[d] = 0;
                for(i=0; i<nproc; i++)
                    if(regions[i].hi[d] > tmp_dims[d]) {
                        block[d]++;
                        tmp_dims[d] = regions[i].hi[d];
                    }
            }

            /* print the number of processed */
            fprintf(fout, "%d\n", nproc);
            /* print dimensions */
            for(d=0; d<ndim; d++) fprintf(fout, "%d ", dims[d]);
            fprintf(fout, "\n");

            /* print number of lines to draw for each dimension */
            for(d=0; d<ndim; d++) 
                if(block[d] == 1) fprintf(fout, "%d ", block[d]);
                else fprintf(fout, "%d ", block[d]-1);
            fprintf(fout, "\n");

            /* print the offset for each line */
            for(d=0; d<ndim; d++) {
                if(block[d] == 1) fprintf(fout, "%d\n", dims[d]);
                else {
                    tmp_dims[d] = 0;
                    counter = 0;
                    for(i=0; i<nproc; i++)
                        if(regions[i].hi[d] > tmp_dims[d]) {
                            counter++;
                            if(counter == block[d]) break;
                            fprintf(fout, "%d\n",
                                    regions[i].hi[d]+1);
                            tmp_dims[d] = regions[i].hi[d];
                        }
                }
            }
            fclose(fout);
            free(regions); free(proclist);
        }
    }

    tlog[current*2]     = (unsigned long)(tt0 * 1000000);
    tlog[current*2+1]   = (unsigned long)(tt1 * 1000000);
    indlog[current*6]   = *ga;
    indlog[current*6+1] = *ilo;
    indlog[current*6+2] = *ihi;
    indlog[current*6+3] = *jlo;
    indlog[current*6+4] = *jhi;
    indlog[current*6+5] = *op;
    current++;
}